

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::render
          (UniformLocationCase *this,ShaderProgram *program,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
          *uniformList)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deBool dVar5;
  DataType DVar6;
  undefined4 extraout_var;
  TestError *this_00;
  size_type sVar8;
  const_reference type_00;
  TypeComponentVector *path;
  VarType *type_01;
  undefined8 uVar9;
  TestLog *this_01;
  MessageBuilder *pMVar10;
  reference ppTVar11;
  TypeComponentVector *in_R8;
  int local_370;
  int i_1;
  int i;
  MessageBuilder local_348;
  MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> local_1c8;
  Texture2D *local_1b8;
  int local_1b0;
  float local_1ac;
  int binding;
  float expectedValue;
  char *typeName;
  DataType scalarType;
  int gotLoc;
  string name;
  VarType type;
  undefined1 local_140 [8];
  BasicTypeIterator subTypeIter;
  int expectedLocation;
  UniformInfo *uniformInfo;
  uint uniformNdx;
  undefined1 local_100 [8];
  TextureList texList;
  deUint32 uintBuf [4];
  deInt32 intBuf [4];
  float floatBuf [16];
  deUint16 indices [6];
  float position [16];
  deInt32 posLoc;
  deUint32 programID;
  Functions *gl;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  *uniformList_local;
  ShaderProgram *program_local;
  UniformLocationCase *this_local;
  long lVar7;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  dVar4 = glu::ShaderProgram::getProgram(program);
  iVar3 = (**(code **)(lVar7 + 0x780))(dVar4,"a_position");
  memcpy(indices + 2,&DAT_02c0f010,0x40);
  stack0xffffffffffffff7c = 0x2000200010000;
  indices[0] = 1;
  indices[1] = 3;
  memset(intBuf + 2,0,0x40);
  memset(uintBuf + 2,0,0x10);
  memset(&texList.super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,0,0x10);
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::vector
            ((vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)local_100);
  while ((dVar5 = ::deGetFalse(), dVar5 == 0 && (-1 < iVar3))) {
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      (**(code **)(lVar7 + 0x1680))(dVar4);
      for (uniformInfo._0_4_ = 0;
          sVar8 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  ::size(uniformList), (uint)uniformInfo < sVar8;
          uniformInfo._0_4_ = (uint)uniformInfo + 1) {
        type_00 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
                  ::operator[](uniformList,(ulong)(uint)uniformInfo);
        subTypeIter.m_path.
        super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = type_00->location;
        glu::SubTypeIterator<glu::IsBasicType>::begin
                  ((SubTypeIterator<glu::IsBasicType> *)local_140,&type_00->type);
        while( true ) {
          glu::SubTypeIterator<glu::IsBasicType>::end
                    ((SubTypeIterator<glu::IsBasicType> *)((long)&type.m_data + 8),&type_00->type);
          bVar2 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                            ((SubTypeIterator<glu::IsBasicType> *)local_140,
                             (SubTypeIterator<glu::IsBasicType> *)((long)&type.m_data + 8));
          glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator
                    ((SubTypeIterator<glu::IsBasicType> *)((long)&type.m_data + 8));
          if (!bVar2) break;
          path = glu::SubTypeIterator<glu::IsBasicType>::getPath
                           ((SubTypeIterator<glu::IsBasicType> *)local_140);
          glu::getVarType((VarType *)((long)&name.field_2 + 8),&type_00->type,path);
          type_01 = (VarType *)
                    glu::SubTypeIterator<glu::IsBasicType>::getPath
                              ((SubTypeIterator<glu::IsBasicType> *)local_140);
          Functional::(anonymous_namespace)::getUniformName_abi_cxx11_
                    ((string *)&scalarType,(_anonymous_namespace_ *)(ulong)(uint)uniformInfo,
                     (int)type_00,type_01,in_R8);
          pcVar1 = *(code **)(lVar7 + 0xb48);
          uVar9 = std::__cxx11::string::c_str();
          typeName._4_4_ = (*pcVar1)(dVar4,uVar9);
          DVar6 = glu::VarType::getBasicType((VarType *)((long)&name.field_2 + 8));
          typeName._0_4_ = glu::getDataTypeScalarType(DVar6);
          _binding = glu::getDataTypeName((DataType)typeName);
          local_1ac = getExpectedValue((DataType)typeName,
                                       subTypeIter.m_path.
                                       super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                       _binding);
          bVar2 = glu::isDataTypeSampler((DataType)typeName);
          if (bVar2) {
            sVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::size
                              ((vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)
                               local_100);
            local_1b0 = (int)sVar8;
            createTexture(&local_1c8,this,(DataType)typeName,local_1ac,local_1b0);
            local_1b8 = de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::
                        release(&local_1c8);
            std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
                      ((vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)local_100,
                       &local_1b8);
            de::details::MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::~MovePtr
                      (&local_1c8);
            (**(code **)(lVar7 + 0x14f0))(typeName._4_4_,local_1b0);
          }
          else if (-1 < typeName._4_4_) {
            intBuf[2] = (deInt32)local_1ac;
            uintBuf[2] = (deUint32)local_1ac;
            texList.super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)(long)local_1ac;
            this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_348,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar10 = tcu::MessageBuilder::operator<<(&local_348,(char (*) [13])"Set uniform ");
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&scalarType);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [14])" in location ");
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)((long)&typeName + 4));
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [5])0x2bfaa9a);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1ac);
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_348);
            DVar6 = glu::VarType::getBasicType((VarType *)((long)&name.field_2 + 8));
            switch(DVar6) {
            case TYPE_FLOAT:
              (**(code **)(lVar7 + 0x14e8))(typeName._4_4_,1,intBuf + 2);
              break;
            case TYPE_FLOAT_VEC2:
              (**(code **)(lVar7 + 0x1528))(typeName._4_4_,1,intBuf + 2);
              break;
            case TYPE_FLOAT_VEC3:
              (**(code **)(lVar7 + 0x1568))(typeName._4_4_,1,intBuf + 2);
              break;
            case TYPE_FLOAT_VEC4:
              (**(code **)(lVar7 + 0x15a8))(typeName._4_4_,1,intBuf + 2);
              break;
            case TYPE_FLOAT_MAT2:
              (**(code **)(lVar7 + 0x15e0))(typeName._4_4_,1,0,intBuf + 2);
              break;
            case TYPE_FLOAT_MAT2X3:
              (**(code **)(lVar7 + 0x15f0))(typeName._4_4_,1,0,intBuf + 2);
              break;
            case TYPE_FLOAT_MAT2X4:
              (**(code **)(lVar7 + 0x1600))(typeName._4_4_,1,0,intBuf + 2);
              break;
            case TYPE_FLOAT_MAT3X2:
              (**(code **)(lVar7 + 0x1620))(typeName._4_4_,1,0,intBuf + 2);
              break;
            case TYPE_FLOAT_MAT3:
              (**(code **)(lVar7 + 0x1610))(typeName._4_4_,1,0,intBuf + 2);
              break;
            case TYPE_FLOAT_MAT3X4:
              (**(code **)(lVar7 + 0x1630))(typeName._4_4_,1,0,intBuf + 2);
              break;
            case TYPE_FLOAT_MAT4X2:
              (**(code **)(lVar7 + 0x1650))(typeName._4_4_,1,0,intBuf + 2);
              break;
            case TYPE_FLOAT_MAT4X3:
              (**(code **)(lVar7 + 0x1660))(typeName._4_4_,1,0,intBuf + 2);
              break;
            case TYPE_FLOAT_MAT4:
              (**(code **)(lVar7 + 0x1640))(typeName._4_4_,1,0,intBuf + 2);
              break;
            default:
              break;
            case TYPE_INT:
              (**(code **)(lVar7 + 0x14f8))(typeName._4_4_,1,uintBuf + 2);
              break;
            case TYPE_INT_VEC2:
              (**(code **)(lVar7 + 0x1538))(typeName._4_4_,1,uintBuf + 2);
              break;
            case TYPE_INT_VEC3:
              (**(code **)(lVar7 + 0x1578))(typeName._4_4_,1,uintBuf + 2);
              break;
            case TYPE_INT_VEC4:
              (**(code **)(lVar7 + 0x15b8))(typeName._4_4_,1,uintBuf + 2);
              break;
            case TYPE_UINT:
              (**(code **)(lVar7 + 0x1508))
                        (typeName._4_4_,1,
                         &texList.
                          super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              break;
            case TYPE_UINT_VEC2:
              (**(code **)(lVar7 + 0x1548))
                        (typeName._4_4_,1,
                         &texList.
                          super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              break;
            case TYPE_UINT_VEC3:
              (**(code **)(lVar7 + 0x1588))
                        (typeName._4_4_,1,
                         &texList.
                          super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              break;
            case TYPE_UINT_VEC4:
              (**(code **)(lVar7 + 0x15c8))
                        (typeName._4_4_,1,
                         &texList.
                          super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              break;
            case TYPE_BOOL:
              (**(code **)(lVar7 + 0x14f8))(typeName._4_4_,1,uintBuf + 2);
              break;
            case TYPE_BOOL_VEC2:
              (**(code **)(lVar7 + 0x1538))(typeName._4_4_,1,uintBuf + 2);
              break;
            case TYPE_BOOL_VEC3:
              (**(code **)(lVar7 + 0x1578))(typeName._4_4_,1,uintBuf + 2);
              break;
            case TYPE_BOOL_VEC4:
              (**(code **)(lVar7 + 0x15b8))(typeName._4_4_,1,uintBuf + 2);
            }
          }
          subTypeIter.m_path.
          super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               (uint)(-1 < subTypeIter.m_path.
                           super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) +
               subTypeIter.m_path.
               super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          std::__cxx11::string::~string((string *)&scalarType);
          glu::VarType::~VarType((VarType *)((long)&name.field_2 + 8));
          glu::SubTypeIterator<glu::IsBasicType>::operator++
                    ((SubTypeIterator<glu::IsBasicType> *)&i_1,
                     (SubTypeIterator<glu::IsBasicType> *)local_140,0);
          glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator
                    ((SubTypeIterator<glu::IsBasicType> *)&i_1);
        }
        glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator
                  ((SubTypeIterator<glu::IsBasicType> *)local_140);
      }
      (**(code **)(lVar7 + 0x610))(iVar3);
      (**(code **)(lVar7 + 0x19f0))(iVar3,4,0x1406,0,0,indices + 2);
      (**(code **)(lVar7 + 0x568))(4,6,0x1403,floatBuf + 0xf);
      (**(code **)(lVar7 + 0x518))(iVar3);
      for (local_370 = 0;
          sVar8 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::size
                            ((vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)
                             local_100), local_370 < (int)sVar8; local_370 = local_370 + 1) {
        ppTVar11 = std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::operator[]
                             ((vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)
                              local_100,(long)local_370);
        if (*ppTVar11 != (value_type)0x0) {
          (*(*ppTVar11)->_vptr_Texture2D[1])();
        }
      }
      std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::~vector
                ((vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_> *)local_100);
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fUniformLocationTests.cpp"
             ,0x224);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void UniformLocationCase::render (const glu::ShaderProgram& program, const vector<UniformInfo>& uniformList)
{
	using glu::Texture2D;
	using de::MovePtr;
	typedef vector<Texture2D*> TextureList;

	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	const deUint32			programID		= program.getProgram();
	const deInt32			posLoc			= gl.getAttribLocation(programID, "a_position");

	// Vertex data.
	const float position[] =
	{
		-1.0f, -1.0f, 0.1f,	1.0f,
		-1.0f,  1.0f, 0.1f,	1.0f,
		 1.0f, -1.0f, 0.1f,	1.0f,
		 1.0f,  1.0f, 0.1f,	1.0f
	};
	const deUint16			indices[]		= { 0, 1, 2, 2, 1, 3 };

	// some buffers to feed to the GPU, only the first element is relevant since the others are never verified
	float					floatBuf[16]	= {0.0f};
	deInt32					intBuf[4]		= {0};
	deUint32				uintBuf[4]		= {0};

	TextureList				texList;

	TCU_CHECK(posLoc >= 0);
	gl.useProgram(programID);

	try
	{

		// Set uniforms
		for (unsigned int uniformNdx = 0; uniformNdx < uniformList.size(); uniformNdx++)
		{
			const UniformInfo&	uniformInfo			= uniformList[uniformNdx];
			int					expectedLocation	= uniformInfo.location;

			for (glu::BasicTypeIterator subTypeIter = glu::BasicTypeIterator::begin(&uniformInfo.type); subTypeIter != glu::BasicTypeIterator::end(&uniformInfo.type); subTypeIter++)
			{
				const glu::VarType	type			= glu::getVarType(uniformInfo.type, subTypeIter.getPath());
				const string		name			= getUniformName(uniformNdx, uniformInfo.type, subTypeIter.getPath());
				const int			gotLoc			= gl.getUniformLocation(programID, name.c_str());
				const glu::DataType	scalarType		= glu::getDataTypeScalarType(type.getBasicType());
				const char*	const	typeName		= glu::getDataTypeName(scalarType);
				const float			expectedValue	= getExpectedValue(scalarType, expectedLocation, typeName);

				if (glu::isDataTypeSampler(scalarType))
				{
					const int binding = (int)texList.size();

					texList.push_back(createTexture(scalarType, expectedValue, binding).release());
					gl.uniform1i(gotLoc, binding);
				}
				else if(gotLoc >= 0)
				{
					floatBuf[0] = expectedValue;
					intBuf[0]   = int(expectedValue);
					uintBuf[0]  = deUint32(expectedValue);

					m_testCtx.getLog() << tcu::TestLog::Message << "Set uniform " << name << " in location " << gotLoc << " to " << expectedValue << tcu::TestLog::EndMessage;

					switch (type.getBasicType())
					{
						case glu::TYPE_FLOAT:			gl.uniform1fv(gotLoc, 1, floatBuf);					break;
						case glu::TYPE_FLOAT_VEC2:		gl.uniform2fv(gotLoc, 1, floatBuf);					break;
						case glu::TYPE_FLOAT_VEC3:		gl.uniform3fv(gotLoc, 1, floatBuf);					break;
						case glu::TYPE_FLOAT_VEC4:		gl.uniform4fv(gotLoc, 1, floatBuf);					break;

						case glu::TYPE_INT:				gl.uniform1iv(gotLoc, 1, intBuf);					break;
						case glu::TYPE_INT_VEC2:		gl.uniform2iv(gotLoc, 1, intBuf);					break;
						case glu::TYPE_INT_VEC3:		gl.uniform3iv(gotLoc, 1, intBuf);					break;
						case glu::TYPE_INT_VEC4:		gl.uniform4iv(gotLoc, 1, intBuf);					break;

						case glu::TYPE_UINT:			gl.uniform1uiv(gotLoc, 1, uintBuf);					break;
						case glu::TYPE_UINT_VEC2:		gl.uniform2uiv(gotLoc, 1, uintBuf);					break;
						case glu::TYPE_UINT_VEC3:		gl.uniform3uiv(gotLoc, 1, uintBuf);					break;
						case glu::TYPE_UINT_VEC4:		gl.uniform4uiv(gotLoc, 1, uintBuf);					break;

						case glu::TYPE_BOOL:			gl.uniform1iv(gotLoc, 1, intBuf);					break;
						case glu::TYPE_BOOL_VEC2:		gl.uniform2iv(gotLoc, 1, intBuf);					break;
						case glu::TYPE_BOOL_VEC3:		gl.uniform3iv(gotLoc, 1, intBuf);					break;
						case glu::TYPE_BOOL_VEC4:		gl.uniform4iv(gotLoc, 1, intBuf);					break;

						case glu::TYPE_FLOAT_MAT2:		gl.uniformMatrix2fv(gotLoc, 1, false, floatBuf);	break;
						case glu::TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(gotLoc, 1, false, floatBuf);	break;
						case glu::TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(gotLoc, 1, false, floatBuf);	break;

						case glu::TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(gotLoc, 1, false, floatBuf);	break;
						case glu::TYPE_FLOAT_MAT3:		gl.uniformMatrix3fv(gotLoc, 1, false, floatBuf);	break;
						case glu::TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(gotLoc, 1, false, floatBuf);	break;

						case glu::TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(gotLoc, 1, false, floatBuf);	break;
						case glu::TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(gotLoc, 1, false, floatBuf);	break;
						case glu::TYPE_FLOAT_MAT4:		gl.uniformMatrix4fv(gotLoc, 1, false, floatBuf);	break;
						default:
							DE_ASSERT(false);
					}
				}

				expectedLocation += expectedLocation>=0;
			}
		}

		gl.enableVertexAttribArray(posLoc);
		gl.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);

		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, &indices[0]);

		gl.disableVertexAttribArray(posLoc);
	}
	catch(...)
	{
		for (int i = 0; i < int(texList.size()); i++)
			delete texList[i];

		throw;
	}

	for (int i = 0; i < int(texList.size()); i++)
		delete texList[i];
}